

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(void)

{
  MetaLog<deflog> *pMVar1;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  allocator<char> local_c9;
  string local_c8;
  ulong local_a8;
  size_t i;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60 [2];
  allocator<char> local_39;
  string local_38;
  MetaLog<deflog> *local_18;
  MetaLog<deflog> *metalog_instance;
  
  metalog_instance._4_4_ = 0;
  pMVar1 = MetaLog<deflog>::GetInstance();
  local_18 = pMVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"/home/usr/test_log",&local_39);
  MetaLog<deflog>::Init(pMVar1,ERROR,'\x06',&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pMVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_60,"the state is %\n");
  MetaLog<deflog>::UniqueLog<char_const*>(pMVar1,ERROR,local_60,"A");
  pMVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_70,"the state is %\n");
  MetaLog<deflog>::UniqueLog<char_const*>(pMVar1,ERROR,&local_70,"A");
  pMVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_80,"the state is %\n");
  MetaLog<deflog>::UniqueLog<char_const*>(pMVar1,ERROR,&local_80,"A");
  pMVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_90,"the state is %\n");
  MetaLog<deflog>::UniqueLog<char_const*>(pMVar1,ERROR,&local_90,"B");
  pMVar1 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&i,"the state is %\n");
  MetaLog<deflog>::UniqueLog<char_const*>(pMVar1,ERROR,(string_view *)&i,"A");
  for (local_a8 = 0; pMVar1 = local_18, local_a8 < 50000000; local_a8 = local_a8 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,">>>>>>>>>>>> timed log %\n",&local_c9);
    MetaLog<deflog>::TimedLog<unsigned_long>(pMVar1,ERROR,0,200,&local_c8,local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    pMVar1 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_e0,"<<<<<<<<<<<< normal log %\n");
    MetaLog<deflog>::Log<unsigned_long>(pMVar1,ERROR,&local_e0,local_a8);
  }
  MetaLog<deflog>::FlushStreams(local_18);
  return 0;
}

Assistant:

int main() {
    auto& metalog_instance = MetaLog<deflog>::GetInstance();
    metalog_instance.Init(deflog::ERROR, output::out | output::logfile, "/home/usr/test_log");
    metalog_instance.UniqueLog(deflog::ERROR, "the state is %\n", "A"); // prints
    metalog_instance.UniqueLog(deflog::ERROR, "the state is %\n", "A"); // nope
    metalog_instance.UniqueLog(deflog::ERROR, "the state is %\n", "A"); // nope
    metalog_instance.UniqueLog(deflog::ERROR, "the state is %\n", "B"); // prints
    metalog_instance.UniqueLog(deflog::ERROR, "the state is %\n", "A"); // nope
    for (size_t i = 0; i < 50000000; ++i) {
        metalog_instance.TimedLog(deflog::ERROR, 0, 200, ">>>>>>>>>>>> timed log %\n", i);
        metalog_instance.Log(deflog::ERROR, "<<<<<<<<<<<< normal log %\n", i);
    }
    metalog_instance.FlushStreams();
    return 0;
}